

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slatm1.c
# Opt level: O3

int slatm1_slu(int *mode,float *cond,int *irsign,int *idist,int *iseed,float *d,int *n,int *info)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  float fVar15;
  int iVar17;
  undefined1 auVar16 [16];
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int local_34;
  
  *info = 0;
  auVar5 = _DAT_0011c570;
  auVar4 = _DAT_0011c560;
  auVar3 = _DAT_0011c4f0;
  uVar1 = *n;
  uVar11 = (ulong)uVar1;
  if (uVar11 == 0) {
    return 0;
  }
  iVar7 = *mode;
  if (iVar7 - 7U < 0xfffffff3) {
    local_34 = 1;
    iVar7 = -1;
    goto LAB_00108bfb;
  }
  if (iVar7 == -6) goto LAB_00108a3f;
  if (iVar7 == 0) goto LAB_00108aa5;
  if (iVar7 == 6) goto LAB_00108a3f;
  if (1 < (uint)*irsign) {
    local_34 = 2;
    iVar7 = -2;
    goto LAB_00108bfb;
  }
  if (iVar7 == -6) {
LAB_00108a3f:
    if (*idist - 4U < 0xfffffffd) {
      local_34 = 4;
      iVar7 = -4;
      goto LAB_00108bfb;
    }
  }
  else if (iVar7 != 0) {
    if (iVar7 != 6) {
      if (*cond <= 1.0 && *cond != 1.0) {
        local_34 = 3;
        iVar7 = -3;
        goto LAB_00108bfb;
      }
      if ((iVar7 != 6) && (iVar7 != -6)) goto LAB_00108aa5;
    }
    goto LAB_00108a3f;
  }
LAB_00108aa5:
  if (-1 < (int)uVar1) {
    if (iVar7 == 0) {
      return 0;
    }
    iVar6 = -iVar7;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    switch(iVar6) {
    case 2:
      slatm1_slu::i = uVar1 + 1;
      lVar10 = uVar11 - 1;
      auVar21._8_4_ = (int)lVar10;
      auVar21._0_8_ = lVar10;
      auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar8 = 0;
      auVar21 = auVar21 ^ _DAT_0011c4f0;
      do {
        auVar20._8_4_ = (int)uVar8;
        auVar20._0_8_ = uVar8;
        auVar20._12_4_ = (int)(uVar8 >> 0x20);
        auVar16 = (auVar20 | auVar5) ^ auVar3;
        iVar7 = auVar21._4_4_;
        if ((bool)(~(auVar16._4_4_ == iVar7 && auVar21._0_4_ < auVar16._0_4_ ||
                    iVar7 < auVar16._4_4_) & 1)) {
          d[uVar8] = 1.0;
        }
        if ((auVar16._12_4_ != auVar21._12_4_ || auVar16._8_4_ <= auVar21._8_4_) &&
            auVar16._12_4_ <= auVar21._12_4_) {
          d[uVar8 + 1] = 1.0;
        }
        auVar16 = (auVar20 | auVar4) ^ auVar3;
        iVar6 = auVar16._4_4_;
        if (iVar6 <= iVar7 && (iVar6 != iVar7 || auVar16._0_4_ <= auVar21._0_4_)) {
          d[uVar8 + 2] = 1.0;
          d[uVar8 + 3] = 1.0;
        }
        uVar8 = uVar8 + 4;
      } while ((uVar1 + 3 & 0xfffffffc) != uVar8);
      d[uVar11 - 1] = 1.0 / *cond;
      break;
    case 3:
      *d = 1.0;
      if (uVar1 != 1) {
        dVar14 = pow((double)*cond,(double)(-1.0 / (float)(int)(uVar1 - 1)));
        slatm1_slu::alpha = (float)dVar14;
        iVar7 = *n;
        slatm1_slu::i = 2;
        if (1 < iVar7) {
          lVar10 = 1;
          do {
            fVar12 = powif(slatm1_slu::alpha,(int)lVar10);
            lVar10 = (long)slatm1_slu::i;
            d[lVar10 + -1] = fVar12;
            iVar6 = slatm1_slu::i + 1;
            bVar2 = slatm1_slu::i < iVar7;
            slatm1_slu::i = iVar6;
          } while (bVar2);
        }
      }
      break;
    case 4:
      *d = 1.0;
      auVar5 = _DAT_0011c570;
      auVar4 = _DAT_0011c560;
      auVar3 = _DAT_0011c4f0;
      if (uVar1 != 1) {
        fVar15 = 1.0 / *cond;
        fVar12 = (1.0 - fVar15) / (float)(int)(uVar1 - 1);
        lVar10 = uVar11 - 2;
        auVar16._8_4_ = (int)lVar10;
        auVar16._0_8_ = lVar10;
        auVar16._12_4_ = (int)((ulong)lVar10 >> 0x20);
        iVar7 = 2;
        iVar6 = 3;
        iVar18 = 4;
        iVar19 = 5;
        uVar11 = 0;
        auVar16 = auVar16 ^ _DAT_0011c4f0;
        slatm1_slu::alpha = fVar12;
        do {
          auVar22._8_4_ = (int)uVar11;
          auVar22._0_8_ = uVar11;
          auVar22._12_4_ = (int)(uVar11 >> 0x20);
          auVar21 = (auVar22 | auVar5) ^ auVar3;
          iVar17 = auVar16._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar17 && auVar16._0_4_ < auVar21._0_4_ ||
                      iVar17 < auVar21._4_4_) & 1)) {
            d[uVar11 + 1] = (float)(int)(uVar1 - iVar7) * fVar12 + fVar15;
          }
          if ((auVar21._12_4_ != auVar16._12_4_ || auVar21._8_4_ <= auVar16._8_4_) &&
              auVar21._12_4_ <= auVar16._12_4_) {
            d[uVar11 + 2] = (float)(int)(uVar1 - iVar6) * fVar12 + fVar15;
          }
          auVar21 = (auVar22 | auVar4) ^ auVar3;
          iVar23 = auVar21._4_4_;
          if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar21._0_4_ <= auVar16._0_4_)) {
            d[uVar11 + 3] = (float)(int)(uVar1 - iVar18) * fVar12 + fVar15;
            d[uVar11 + 4] = (float)(int)(uVar1 - iVar19) * fVar12 + fVar15;
          }
          uVar11 = uVar11 + 4;
          iVar7 = iVar7 + 4;
          iVar6 = iVar6 + 4;
          iVar18 = iVar18 + 4;
          iVar19 = iVar19 + 4;
          slatm1_slu::i = uVar1 + 1;
        } while ((uVar1 + 2 & 0xfffffffc) != uVar11);
      }
      break;
    case 5:
      dVar14 = log((double)(1.0 / *cond));
      slatm1_slu::alpha = (float)dVar14;
      iVar7 = *n;
      slatm1_slu::i = 1;
      if (0 < iVar7) {
        do {
          dVar14 = (double)slatm1_slu::alpha;
          dVar13 = dlaran_sluslu(iseed);
          dVar14 = exp(dVar13 * dVar14);
          d[(long)slatm1_slu::i + -1] = (float)dVar14;
          iVar6 = slatm1_slu::i + 1;
          bVar2 = slatm1_slu::i < iVar7;
          slatm1_slu::i = iVar6;
        } while (bVar2);
      }
      break;
    case 6:
      slarnv_slu(idist,iseed,n,d);
      break;
    default:
      slatm1_slu::i = uVar1 + 1;
      uVar8 = 0;
      do {
        d[uVar8] = 1.0 / *cond;
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
      *d = 1.0;
    }
    iVar7 = *mode;
    if (((0xc < iVar7 + 6U) || ((0x1041U >> (iVar7 + 6U & 0x1f) & 1) == 0)) && (*irsign == 1)) {
      iVar6 = *n;
      slatm1_slu::i = 1;
      if (0 < iVar6) {
        do {
          dVar14 = dlaran_sluslu(iseed);
          if (0.5 < (float)dVar14) {
            d[(long)slatm1_slu::i + -1] = -d[(long)slatm1_slu::i + -1];
          }
          iVar7 = slatm1_slu::i + 1;
          bVar2 = slatm1_slu::i < iVar6;
          slatm1_slu::i = iVar7;
        } while (bVar2);
        iVar7 = *mode;
      }
    }
    if (-1 < iVar7) {
      return 0;
    }
    uVar1 = *n;
    if ((int)uVar1 < 2) {
      slatm1_slu::i = 1;
      return 0;
    }
    pfVar9 = d + uVar1;
    uVar11 = 0;
    do {
      pfVar9 = pfVar9 + -1;
      fVar12 = d[uVar11];
      d[uVar11] = *pfVar9;
      *pfVar9 = fVar12;
      uVar11 = uVar11 + 1;
    } while (uVar1 >> 1 != uVar11);
    slatm1_slu::i = (uVar1 >> 1) + 1;
    return 0;
  }
  local_34 = 7;
  iVar7 = -7;
LAB_00108bfb:
  *info = iVar7;
  input_error("SLATM1",&local_34);
  return 0;
}

Assistant:

int slatm1_slu(int *mode, float *cond, int *irsign,
	int *idist, int *iseed, float *d, int *n, int *info)
{
    /* System generated locals */
    int i__1, i__2;
    double d__1, d__2;

    /* Local variables */
    static float temp;
    static int i;
    static float alpha;
    extern int input_error(char *, int *);
    extern double dlaran_sluslu(int *);
    extern /* Subroutine */ int slarnv_slu(int *, int *, int *, float
	    *);


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

       SLATM1 computes the entries of D(1..N) as specified by   
       MODE, COND and IRSIGN. IDIST and ISEED determine the generation   
       of random numbers. SLATM1 is called by SLATMR to generate   
       random test matrices for LAPACK programs.   

    Arguments   
    =========   

    MODE   - INTEGER   
             On entry describes how D is to be computed:   
             MODE = 0 means do not change D.   
             MODE = 1 sets D(1)=1 and D(2:N)=1.0/COND   
             MODE = 2 sets D(1:N-1)=1 and D(N)=1.0/COND   
             MODE = 3 sets D(I)=COND**(-(I-1)/(N-1))   
             MODE = 4 sets D(i)=1 - (i-1)/(N-1)*(1 - 1/COND)   
             MODE = 5 sets D to random numbers in the range   
                      ( 1/COND , 1 ) such that their logarithms   
                      are uniformly distributed.   
             MODE = 6 set D to random numbers from same distribution   
                      as the rest of the matrix.   
             MODE < 0 has the same meaning as ABS(MODE), except that   
                the order of the elements of D is reversed.   
             Thus if MODE is positive, D has entries ranging from   
                1 to 1/COND, if negative, from 1/COND to 1,   
             Not modified.   

    COND   - REAL   
             On entry, used as described under MODE above.   
             If used, it must be >= 1. Not modified.   

    IRSIGN - INTEGER   
             On entry, if MODE neither -6, 0 nor 6, determines sign of   
             entries of D   
             0 => leave entries of D unchanged   
             1 => multiply each entry of D by 1 or -1 with probability .5 
  

    IDIST  - CHARACTER*1   
             On entry, IDIST specifies the type of distribution to be   
             used to generate a random matrix .   
             1 => UNIFORM( 0, 1 )   
             2 => UNIFORM( -1, 1 )   
             3 => NORMAL( 0, 1 )   
             Not modified.   

    ISEED  - INTEGER array, dimension ( 4 )   
             On entry ISEED specifies the seed of the random number   
             generator. The random number generator uses a   
             linear congruential sequence limited to small   
             integers, and so should produce machine independent   
             random numbers. The values of ISEED are changed on   
             exit, and can be used in the next call to SLATM1   
             to continue the same random number sequence.   
             Changed on exit.   

    D      - REAL array, dimension ( MIN( M , N ) )   
             Array to be computed according to MODE, COND and IRSIGN.   
             May be changed on exit if MODE is nonzero.   

    N      - INTEGER   
             Number of entries of D. Not modified.   

    INFO   - INTEGER   
              0  => normal termination   
             -1  => if MODE not in range -6 to 6   
             -2  => if MODE neither -6, 0 nor 6, and   
                    IRSIGN neither 0 nor 1   
             -3  => if MODE neither -6, 0 nor 6 and COND less than 1   
             -4  => if MODE equals 6 or -6 and IDIST not in range 1 to 3 
  
             -7  => if N negative   

    ===================================================================== 
  


       Decode and Test the input parameters. Initialize flags & seed.   

       Parameter adjustments */
    --d;
    --iseed;

    /* Function Body */
    *info = 0;

/*     Quick return if possible */

    if (*n == 0) {
	return 0;
    }

/*     Set INFO if an error */

    if (*mode < -6 || *mode > 6) {
	*info = -1;
    } else if (*mode != -6 && *mode != 0 && *mode != 6 && (*irsign != 0 && *
	    irsign != 1)) {
	*info = -2;
    } else if (*mode != -6 && *mode != 0 && *mode != 6 && *cond < 1.f) {
	*info = -3;
    } else if ((*mode == 6 || *mode == -6) && (*idist < 1 || *idist > 3)) {
	*info = -4;
    } else if (*n < 0) {
	*info = -7;
    }

    if (*info != 0) {
	i__1 = -(*info);
	input_error("SLATM1", &i__1);
	return 0;
    }

/*     Compute D according to COND and MODE */

    if (*mode != 0) {
	switch (abs(*mode)) {
	    case 1:  goto L10;
	    case 2:  goto L30;
	    case 3:  goto L50;
	    case 4:  goto L70;
	    case 5:  goto L90;
	    case 6:  goto L110;
	}

/*        One large D value: */

L10:
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = 1.f / *cond;
/* L20: */
	}
	d[1] = 1.f;
	goto L120;

/*        One small D value: */

L30:
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = 1.f;
/* L40: */
	}
	d[*n] = 1.f / *cond;
	goto L120;

/*        Exponentially distributed D values: */

L50:
	d[1] = 1.f;
	if (*n > 1) {
	    d__1 = (double) (*cond);
	    d__2 = (double) (-1.f / (float) (*n - 1));
            alpha = pow(d__1, d__2);
	    i__1 = *n;
	    for (i = 2; i <= i__1; ++i) {
		i__2 = i - 1;
		d[i] = powif(alpha, i__2);
/* L60: */
	    }
	}
	goto L120;

/*        Arithmetically distributed D values: */

L70:
	d[1] = 1.f;
	if (*n > 1) {
	    temp = 1.f / *cond;
	    alpha = (1.f - temp) / (float) (*n - 1);
	    i__1 = *n;
	    for (i = 2; i <= i__1; ++i) {
		d[i] = (float) (*n - i) * alpha + temp;
/* L80: */
	    }
	}
	goto L120;

/*        Randomly distributed D values on ( 1/COND , 1): */

L90:
	alpha = log(1.f / *cond);
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = exp(alpha * dlaran_sluslu(&iseed[1]));
/* L100: */
	}
	goto L120;

/*        Randomly distributed D values from IDIST */

L110:
	slarnv_slu(idist, &iseed[1], n, &d[1]);

L120:

/*        If MODE neither -6 nor 0 nor 6, and IRSIGN = 1, assign   
          random signs to D */

	if (*mode != -6 && *mode != 0 && *mode != 6 && *irsign == 1) {
	    i__1 = *n;
	    for (i = 1; i <= i__1; ++i) {
		temp = dlaran_sluslu(&iseed[1]);
		if (temp > .5f) {
		    d[i] = -(double)d[i];
		}
/* L130: */
	    }
	}

/*        Reverse if MODE < 0 */

	if (*mode < 0) {
	    i__1 = *n / 2;
	    for (i = 1; i <= i__1; ++i) {
		temp = d[i];
		d[i] = d[*n + 1 - i];
		d[*n + 1 - i] = temp;
/* L140: */
	    }
	}

    }

    return 0;

/*     End of SLATM1 */

}